

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

rel_iterator * __thiscall
dg::vr::ValueRelations::begin_related
          (rel_iterator *__return_storage_ptr__,ValueRelations *this,V val,Relations *rels)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var3 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = p_Var1;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*(V *)(p_Var3 + 1) >= val) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(V *)(p_Var3 + 1) < val];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((p_Var2 != p_Var1) && (*(V *)(p_Var2 + 1) <= val)) {
      p_Var1 = p_Var2;
    }
  }
  RelatedValueIterator::RelatedValueIterator
            (__return_storage_ptr__,this,(Handle)p_Var1[1]._M_parent,rels);
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::rel_iterator
ValueRelations::begin_related(V val, const Relations &rels) const {
    assert(valToBucket.find(val) != valToBucket.end());
    Handle h = valToBucket.find(val)->second;
    return {*this, h, rels};
}